

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_packbits.c
# Opt level: O1

int PackBitsDecode(TIFF *tif,uint8_t *op,tmsize_t occ,uint16_t s)

{
  long lVar1;
  long lVar2;
  long c;
  uint8_t *puVar3;
  uint8_t *local_40;
  
  puVar3 = tif->tif_rawcp;
  lVar2 = tif->tif_rawcc;
  local_40 = op;
  do {
    if ((lVar2 < 1) || (occ < 1)) goto LAB_002b0013;
    lVar1 = (long)(char)*puVar3;
    if (lVar1 < 0) {
      lVar1 = 1 - lVar1;
      c = lVar1;
      if (occ < lVar1) {
        TIFFWarningExtR(tif,"PackBitsDecode","Discarding %ld bytes to avoid buffer overrun");
        c = occ;
      }
      if (lVar2 == 1) {
        lVar2 = 0;
LAB_002b006c:
        TIFFWarningExtR(tif,"PackBitsDecode","Terminating PackBitsDecode due to lack of data.");
        puVar3 = puVar3 + 1;
LAB_002b0013:
        tif->tif_rawcp = puVar3;
        tif->tif_rawcc = lVar2;
        if (occ >= 1) {
          TIFFErrorExtR(tif,"PackBitsDecode","Not enough data for scanline %u",(ulong)tif->tif_row);
        }
        return (uint)(occ < 1);
      }
      if (occ < lVar1) {
        lVar1 = occ;
      }
      if (0 < lVar1) {
        lVar1 = 1;
      }
      memset(local_40,(uint)puVar3[1],(c - lVar1) + 1);
      lVar1 = (c - lVar1) + 1;
    }
    else {
      if (occ <= lVar1) {
        TIFFWarningExtR(tif,"PackBitsDecode","Discarding %ld bytes to avoid buffer overrun",
                        (lVar1 - occ) + 1);
        lVar1 = occ + -1;
      }
      c = lVar1 + 1;
      if (lVar2 <= c) {
        lVar2 = lVar2 + -1;
        goto LAB_002b006c;
      }
      _TIFFmemcpy(local_40,puVar3 + 1,c);
      puVar3 = puVar3 + lVar1;
      lVar2 = lVar2 - lVar1;
      lVar1 = c;
    }
    local_40 = local_40 + lVar1;
    lVar2 = lVar2 + -2;
    puVar3 = puVar3 + 2;
    occ = occ - c;
  } while( true );
}

Assistant:

static int PackBitsDecode(TIFF *tif, uint8_t *op, tmsize_t occ, uint16_t s)
{
    static const char module[] = "PackBitsDecode";
    int8_t *bp;
    tmsize_t cc;
    long n;
    int b;

    (void)s;
    bp = (int8_t *)tif->tif_rawcp;
    cc = tif->tif_rawcc;
    while (cc > 0 && occ > 0)
    {
        n = (long)*bp++;
        cc--;
        if (n < 0)
        {                  /* replicate next byte -n+1 times */
            if (n == -128) /* nop */
                continue;
            n = -n + 1;
            if (occ < (tmsize_t)n)
            {
                TIFFWarningExtR(tif, module,
                                "Discarding %" TIFF_SSIZE_FORMAT
                                " bytes to avoid buffer overrun",
                                (tmsize_t)n - occ);
                n = (long)occ;
            }
            if (cc == 0)
            {
                TIFFWarningExtR(
                    tif, module,
                    "Terminating PackBitsDecode due to lack of data.");
                break;
            }
            occ -= n;
            b = *bp++;
            cc--;
            while (n-- > 0)
                *op++ = (uint8_t)b;
        }
        else
        { /* copy next n+1 bytes literally */
            if (occ < (tmsize_t)(n + 1))
            {
                TIFFWarningExtR(tif, module,
                                "Discarding %" TIFF_SSIZE_FORMAT
                                " bytes to avoid buffer overrun",
                                (tmsize_t)n - occ + 1);
                n = (long)occ - 1;
            }
            if (cc < (tmsize_t)(n + 1))
            {
                TIFFWarningExtR(
                    tif, module,
                    "Terminating PackBitsDecode due to lack of data.");
                break;
            }
            _TIFFmemcpy(op, bp, ++n);
            op += n;
            occ -= n;
            bp += n;
            cc -= n;
        }
    }
    tif->tif_rawcp = (uint8_t *)bp;
    tif->tif_rawcc = cc;
    if (occ > 0)
    {
        TIFFErrorExtR(tif, module, "Not enough data for scanline %" PRIu32,
                      tif->tif_row);
        return (0);
    }
    return (1);
}